

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Config::Config(Config *this,ConfigData *data)

{
  bool bVar1;
  pointer pbVar2;
  pointer pbVar3;
  size_t i;
  ulong uVar4;
  long lVar5;
  string groupName;
  string filter;
  TestCaseFilters filters;
  allocator local_13a;
  allocator local_139;
  vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> *local_138;
  ConfigData *local_130;
  Config *local_128;
  string local_120;
  TestCaseFilter local_100;
  string local_d8;
  string local_b8;
  TestCaseFilters local_98;
  
  (this->super_SharedImpl<Catch::IConfig>).m_rc = 0;
  (this->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable.
  _vptr_NonCopyable = (_func_int **)&PTR__Config_00157a90;
  ConfigData::ConfigData(&this->m_data,data);
  (this->m_stream).streamBuf = (streambuf *)0x0;
  (this->m_stream).isOwned = false;
  std::ostream::ostream(&this->m_os,*(streambuf **)(__cxa_end_catch + *(long *)(std::cout + -0x18)))
  ;
  (this->m_filterSets).
  super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_filterSets).
  super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_filterSets).
  super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar3 = (data->testsOrTags).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (data->testsOrTags).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar3 != pbVar2) {
    local_138 = &this->m_filterSets;
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    local_120._M_string_length = 0;
    local_120.field_2._M_local_buf[0] = '\0';
    local_128 = this;
    for (uVar4 = 0; uVar4 < (ulong)((long)pbVar2 - (long)pbVar3 >> 5); uVar4 = uVar4 + 1) {
      if (uVar4 != 0) {
        std::__cxx11::string::append((char *)&local_120);
      }
      std::__cxx11::string::append((string *)&local_120);
      pbVar3 = (data->testsOrTags).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (data->testsOrTags).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    local_130 = &this->m_data;
    TestCaseFilters::TestCaseFilters(&local_98,&local_120);
    lVar5 = 0;
    for (uVar4 = 0;
        pbVar3 = (data->testsOrTags).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar4 < (ulong)((long)(data->testsOrTags).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5);
        uVar4 = uVar4 + 1) {
      std::__cxx11::string::string
                ((string *)&local_b8,(string *)((long)&(pbVar3->_M_dataplus)._M_p + lVar5));
      std::__cxx11::string::string((string *)&local_100,"[",&local_139);
      bVar1 = startsWith(&local_b8,&local_100.m_stringToMatch);
      if (bVar1) {
        std::__cxx11::string::~string((string *)&local_100);
LAB_00138aaa:
        TestCaseFilters::addTags(&local_98,&local_b8);
      }
      else {
        std::__cxx11::string::string((string *)&local_d8,"~[",&local_13a);
        bVar1 = startsWith(&local_b8,&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_100);
        if (bVar1) goto LAB_00138aaa;
        TestCaseFilter::TestCaseFilter(&local_100,&local_b8,AutoDetectBehaviour);
        TestCaseFilters::addFilter(&local_98,&local_100);
        std::__cxx11::string::~string((string *)&local_100);
      }
      std::__cxx11::string::~string((string *)&local_b8);
      lVar5 = lVar5 + 0x20;
    }
    std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::push_back
              (local_138,&local_98);
    TestCaseFilters::~TestCaseFilters(&local_98);
    std::__cxx11::string::~string((string *)&local_120);
  }
  return;
}

Assistant:

Config( ConfigData const& data )
        :   m_data( data ),
            m_os( std::cout.rdbuf() )
        {
            if( !data.testsOrTags.empty() ) {
                std::string groupName;
                for( std::size_t i = 0; i < data.testsOrTags.size(); ++i ) {
                    if( i != 0 )
                        groupName += " ";
                    groupName += data.testsOrTags[i];
                }
                TestCaseFilters filters( groupName );
                for( std::size_t i = 0; i < data.testsOrTags.size(); ++i ) {
                    std::string filter = data.testsOrTags[i];
                    if( startsWith( filter, "[" ) || startsWith( filter, "~[" ) )
                        filters.addTags( filter );
                    else
                        filters.addFilter( TestCaseFilter( filter ) );
                }
                m_filterSets.push_back( filters );
            }
        }